

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ParamListStandard::assignMap
          (ParamListStandard *this,vector<Datatype_*,_std::allocator<Datatype_*>_> *proto,
          bool isinput,TypeFactory *typefactory,
          vector<ParameterPieces,_std::allocator<ParameterPieces>_> *res)

{
  uint4 *puVar1;
  pointer ppDVar2;
  AddrSpace *pAVar3;
  TypePointer *status_00;
  pointer pPVar4;
  LowlevelError *pLVar5;
  undefined7 in_register_00000011;
  Datatype *pDVar6;
  ulong uVar7;
  allocator_type local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  TypeFactory *local_50;
  vector<int,_std::allocator<int>_> status;
  
  local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
  local_50 = typefactory;
  std::vector<int,_std::allocator<int>_>::vector
            (&status,(long)this->numgroup,(value_type_conflict2 *)&local_78,&local_79);
  if ((int)CONCAT71(in_register_00000011,isinput) == 0) {
    local_78.field_2._M_allocated_capacity = 0;
    local_78.field_2._8_8_ = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
              (res,(ParameterPieces *)&local_78);
    pDVar6 = *(proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pDVar6->metatype == TYPE_VOID) {
      pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      assignAddress((ParamListStandard *)&local_78,(Datatype *)this,
                    (vector<int,_std::allocator<int>_> *)pDVar6);
      pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pPVar4[-1].addr.base = (AddrSpace *)local_78._M_dataplus._M_p;
      pPVar4[-1].addr.offset = local_78._M_string_length;
      pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pPVar4[-1].addr.base == (AddrSpace *)0x0) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+(&local_78,"Cannot assign parameter address for ",
                       &(*(proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>).
                          _M_impl.super__Vector_impl_data._M_start)->name);
        LowlevelError::LowlevelError(pLVar5,&local_78);
        __cxa_throw(pLVar5,&ParamUnassignedError::typeinfo,LowlevelError::~LowlevelError);
      }
      pDVar6 = *(proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    pPVar4[-1].type = pDVar6;
    (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
    super__Vector_impl_data._M_finish[-1].flags = 0;
  }
  else {
    pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pPVar4 -
        (long)(res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
              super__Vector_impl_data._M_start == 0x40) {
      assignAddress((ParamListStandard *)&local_78,(Datatype *)this,
                    (vector<int,_std::allocator<int>_> *)pPVar4[-1].type);
      pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pPVar4[-1].addr.base = (AddrSpace *)local_78._M_dataplus._M_p;
      pPVar4[-1].addr.offset = local_78._M_string_length;
      pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar1 = &pPVar4[-1].flags;
      *puVar1 = *puVar1 | 0x20000000;
      if (pPVar4[-1].addr.base == (AddrSpace *)0x0) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+(&local_78,"Cannot assign parameter address for ",
                       &((res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                         )._M_impl.super__Vector_impl_data._M_finish[-1].type)->name);
        LowlevelError::LowlevelError(pLVar5,&local_78);
        __cxa_throw(pLVar5,&ParamUnassignedError::typeinfo,LowlevelError::~LowlevelError);
      }
    }
    ppDVar2 = (proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar7 = 1;
        uVar7 < (ulong)((long)(proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3);
        uVar7 = uVar7 + 1) {
      local_78.field_2._M_allocated_capacity = 0;
      local_78.field_2._8_8_ = 0;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
                (res,(ParameterPieces *)&local_78);
      pDVar6 = (proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      if ((this->pointermax == 0) || (pDVar6->size <= this->pointermax)) {
        assignAddress((ParamListStandard *)&local_78,(Datatype *)this,
                      (vector<int,_std::allocator<int>_> *)pDVar6);
        pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        pPVar4[-1].addr.base = (AddrSpace *)local_78._M_dataplus._M_p;
        pPVar4[-1].addr.offset = local_78._M_string_length;
      }
      else {
        pAVar3 = this->spacebase;
        if (pAVar3 == (AddrSpace *)0x0) {
          pAVar3 = (local_50->glb->super_AddrSpaceManager).defaultspace;
        }
        status_00 = TypeFactory::getTypePointerAbsolute
                              (local_50,pAVar3->addressSize,pDVar6,pAVar3->wordsize);
        assignAddress((ParamListStandard *)&local_78,(Datatype *)this,
                      (vector<int,_std::allocator<int>_> *)status_00);
        pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        pPVar4[-1].addr.base = (AddrSpace *)local_78._M_dataplus._M_p;
        pPVar4[-1].addr.offset = local_78._M_string_length;
        (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1].type = &status_00->super_Datatype;
        (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1].flags = 0x10000000;
      }
      pPVar4 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pPVar4[-1].addr.base == (AddrSpace *)0x0) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+(&local_78,"Cannot assign parameter address for ",
                       &(proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[uVar7]->name);
        LowlevelError::LowlevelError(pLVar5,&local_78);
        __cxa_throw(pLVar5,&ParamUnassignedError::typeinfo,LowlevelError::~LowlevelError);
      }
      ppDVar2 = (proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pPVar4[-1].type = ppDVar2[uVar7];
      (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
      super__Vector_impl_data._M_finish[-1].flags = 0;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&status.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ParamListStandard::assignMap(const vector<Datatype *> &proto,bool isinput,TypeFactory &typefactory,
				  vector<ParameterPieces> &res) const

{
  vector<int4> status(numgroup,0);

  if (isinput) {
    if (res.size()==2) { // Check for hidden parameters defined by the output list
      res.back().addr = assignAddress(res.back().type,status); // Reserve first param for hidden ret value
      res.back().flags |= Varnode::hiddenretparm;
      if (res.back().addr.isInvalid())
	throw ParamUnassignedError("Cannot assign parameter address for " + res.back().type->getName());
    }
    for(int4 i=1;i<proto.size();++i) {
      res.push_back(ParameterPieces());
      if ((pointermax != 0)&&(proto[i]->getSize() > pointermax)) { // Datatype is too big
	// Assume datatype is stored elsewhere and only the pointer is passed
	AddrSpace *spc = spacebase;
	if (spc == (AddrSpace *)0)
	  spc = typefactory.getArch()->getDefaultSpace();
	int4 pointersize = spc->getAddrSize();
	int4 wordsize = spc->getWordSize();
	Datatype *pointertp = typefactory.getTypePointerAbsolute(pointersize,proto[i],wordsize);
	res.back().addr = assignAddress(pointertp,status);
	res.back().type = pointertp;
	res.back().flags = Varnode::indirectstorage;
      }
      else
	res.back().addr = assignAddress(proto[i],status);
      if (res.back().addr.isInvalid())
	throw ParamUnassignedError("Cannot assign parameter address for " + proto[i]->getName());
      res.back().type = proto[i];
      res.back().flags = 0;
    }
  }
  else {
    res.push_back(ParameterPieces());
    if (proto[0]->getMetatype() != TYPE_VOID) {
      res.back().addr = assignAddress(proto[0],status);
      if (res.back().addr.isInvalid())
	throw ParamUnassignedError("Cannot assign parameter address for " + proto[0]->getName());
    }
    res.back().type = proto[0];
    res.back().flags = 0;
  }
}